

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_connection.h
# Opt level: O1

void __thiscall blcl::net::connection<MsgType>::write_header(connection<MsgType> *this)

{
  transfer_all_t local_31;
  anon_class_8_1_8991fb9c_for_handler_ local_30;
  socket *local_28;
  const_buffers_1 local_20;
  
  local_20.super_const_buffer.data_ =
       tsqueue<blcl::net::message<MsgType>_>::front(&this->outgoing_messages_);
  local_20.super_const_buffer.size_ = 8;
  local_30.this = this;
  local_28 = &this->socket_;
  asio::detail::
  initiate_async_write_buffer_sequence<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>>
  ::operator()((initiate_async_write_buffer_sequence<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>>
                *)&local_28,&local_30,&local_20,&local_31);
  return;
}

Assistant:

void write_header() {
            asio::async_write(socket_, asio::buffer(&outgoing_messages_.front().header, sizeof(message_header<T>)),
                [this](asio::error_code ec, std::size_t length) {
                    if (!ec) {
                        if (outgoing_messages_.front().body.size() > 0) {
                            write_body();
                        } else {
                            outgoing_messages_.pop_front();
                            if (!outgoing_messages_.empty())
                                write_header();
                        }
                    } else {
                        std::cout << "[WARN] " << id_ << ": Write header failed.\n";
                        std::cout << "[WARN] " << id_ << ": " << ec.message() << "\n";
                        socket_.close();
                    }
            });
        }